

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

int __thiscall icu_63::Normalizer2Impl::init(Normalizer2Impl *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint16_t *in_RCX;
  UCPTrie *in_RDX;
  uint8_t *in_R8;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(ctx + 0x20);
  auVar2 = pshuflw(auVar2,auVar2,0xe8);
  this->minDecompNoCP = (short)auVar2._0_4_;
  this->minCompNoMaybeCP = (short)((uint)auVar2._0_4_ >> 0x10);
  this->minLcccCP = *(UChar *)(ctx + 0x48);
  this->minYesNo = *(uint16_t *)(ctx + 0x28);
  this->minYesNoMappingsOnly = *(uint16_t *)(ctx + 0x38);
  this->minNoNo = *(uint16_t *)(ctx + 0x2c);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(ctx + 0x3c);
  auVar2 = pshuflw(auVar3,auVar3,0xe8);
  this->minNoNoCompBoundaryBefore = (short)auVar2._0_4_;
  this->minNoNoCompNoMaybeCC = (short)((uint)auVar2._0_4_ >> 0x10);
  this->minNoNoEmpty = *(uint16_t *)(ctx + 0x44);
  this->limitNoNo = *(uint16_t *)(ctx + 0x30);
  uVar1 = *(uint *)(ctx + 0x34) & 0xffff;
  this->minMaybeYes = (uint16_t)*(uint *)(ctx + 0x34);
  this->centerNoNoDelta = (short)(uVar1 >> 3) - 0x41;
  this->normTrie = in_RDX;
  this->maybeYesCompositions = in_RCX;
  this->extraData = in_RCX + ((int)(0xfc00 - uVar1) >> 1);
  this->smallFCD = in_R8;
  return (int)(in_RCX + ((int)(0xfc00 - uVar1) >> 1));
}

Assistant:

void
Normalizer2Impl::init(const int32_t *inIndexes, const UCPTrie *inTrie,
                      const uint16_t *inExtraData, const uint8_t *inSmallFCD) {
    minDecompNoCP = static_cast<UChar>(inIndexes[IX_MIN_DECOMP_NO_CP]);
    minCompNoMaybeCP = static_cast<UChar>(inIndexes[IX_MIN_COMP_NO_MAYBE_CP]);
    minLcccCP = static_cast<UChar>(inIndexes[IX_MIN_LCCC_CP]);

    minYesNo = static_cast<uint16_t>(inIndexes[IX_MIN_YES_NO]);
    minYesNoMappingsOnly = static_cast<uint16_t>(inIndexes[IX_MIN_YES_NO_MAPPINGS_ONLY]);
    minNoNo = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO]);
    minNoNoCompBoundaryBefore = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]);
    minNoNoCompNoMaybeCC = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO_COMP_NO_MAYBE_CC]);
    minNoNoEmpty = static_cast<uint16_t>(inIndexes[IX_MIN_NO_NO_EMPTY]);
    limitNoNo = static_cast<uint16_t>(inIndexes[IX_LIMIT_NO_NO]);
    minMaybeYes = static_cast<uint16_t>(inIndexes[IX_MIN_MAYBE_YES]);
    U_ASSERT((minMaybeYes & 7) == 0);  // 8-aligned for noNoDelta bit fields
    centerNoNoDelta = (minMaybeYes >> DELTA_SHIFT) - MAX_DELTA - 1;

    normTrie=inTrie;

    maybeYesCompositions=inExtraData;
    extraData=maybeYesCompositions+((MIN_NORMAL_MAYBE_YES-minMaybeYes)>>OFFSET_SHIFT);

    smallFCD=inSmallFCD;
}